

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::CertErrorParams2Der::~CertErrorParams2Der(CertErrorParams2Der *this)

{
  (this->super_CertErrorParams)._vptr_CertErrorParams =
       (_func_int **)&PTR__CertErrorParams2Der_005c0738;
  ::std::__cxx11::string::~string((string *)&this->der2_);
  ::std::__cxx11::string::~string((string *)&this->der1_);
  return;
}

Assistant:

CertErrorParams2Der(const char *name1, der::Input der1, const char *name2,
                      der::Input der2)
      : name1_(name1),
        der1_(BytesAsStringView(der1)),
        name2_(name2),
        der2_(BytesAsStringView(der2)) {}